

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O1

void __thiscall QLCDNumber::QLCDNumber(QLCDNumber *this,uint numDigits,QWidget *parent)

{
  QLCDNumberPrivate *this_00;
  QFramePrivate *this_01;
  
  this_01 = (QFramePrivate *)operator_new(0x2c0);
  QFramePrivate::QFramePrivate(this_01);
  *(undefined ***)&this_01->super_QWidgetPrivate = &PTR__QLCDNumberPrivate_00802108;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x18 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x20 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x28 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x30 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x38 = 0;
  *(undefined8 *)&this_01[1].super_QWidgetPrivate.field_0x40 = 0;
  QFrame::QFrame(&this->super_QFrame,this_01,parent,(WindowFlags)0x0);
  *(undefined ***)&(this->super_QFrame).super_QWidget = &PTR_metaObject_00801e00;
  *(undefined ***)&(this->super_QFrame).super_QWidget.super_QPaintDevice = &PTR__QLCDNumber_00801fb8
  ;
  this_00 = *(QLCDNumberPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  this_00->ndigits = numDigits;
  QLCDNumberPrivate::init(this_00,(EVP_PKEY_CTX *)this_01);
  return;
}

Assistant:

QLCDNumber::QLCDNumber(uint numDigits, QWidget *parent)
        : QFrame(*new QLCDNumberPrivate, parent)
{
    Q_D(QLCDNumber);
    d->ndigits = numDigits;
    d->init();
}